

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

uint64_t slang::detail::hashing::hash(void *key,size_t len)

{
  uint64_t uVar1;
  const_reference pvVar2;
  array<unsigned_long,_4UL> *this;
  ulong in_RSI;
  uint8_t *in_RDI;
  uint64_t see2;
  uint64_t see1;
  size_t i;
  uint64_t b;
  uint64_t a;
  uint64_t seed;
  uint8_t *p;
  size_type in_stack_ffffffffffffff58;
  array<unsigned_long,_4UL> *in_stack_ffffffffffffff60;
  ulong local_38;
  size_type local_28;
  uint8_t *local_18;
  
  std::array<unsigned_long,_4UL>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (in_RSI < 0x11) {
    if (in_RSI < 4) {
      if (in_RSI == 0) {
        local_28 = 0;
      }
      else {
        local_28 = r3(in_RDI,in_RSI);
      }
    }
    else {
      uVar1 = r4(in_RDI);
      local_28 = r4(in_RDI + (in_RSI >> 3) * 4);
      local_28 = uVar1 << 0x20 | local_28;
      r4(in_RDI + (in_RSI - 4));
      r4(in_RDI + (in_RSI >> 3) * -4 + (in_RSI - 4));
    }
  }
  else {
    local_38 = in_RSI;
    local_18 = in_RDI;
    if (0x30 < in_RSI) {
      do {
        r8(local_18);
        std::array<unsigned_long,_4UL>::operator[]
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        r8(local_18 + 8);
        mix((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        r8(local_18 + 0x10);
        std::array<unsigned_long,_4UL>::operator[]
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        r8(local_18 + 0x18);
        mix((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        r8(local_18 + 0x20);
        std::array<unsigned_long,_4UL>::operator[]
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        r8(local_18 + 0x28);
        mix((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        local_18 = local_18 + 0x30;
        local_38 = local_38 - 0x30;
      } while (0x30 < local_38);
    }
    for (; 0x10 < local_38; local_38 = local_38 - 0x10) {
      r8(local_18);
      std::array<unsigned_long,_4UL>::operator[]
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      r8(local_18 + 8);
      mix((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_18 = local_18 + 0x10;
    }
    local_28 = r8(local_18 + (local_38 - 0x10));
    r8(local_18 + (local_38 - 8));
  }
  pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this = (array<unsigned_long,_4UL> *)(*pvVar2 ^ in_RSI);
  std::array<unsigned_long,_4UL>::operator[](this,local_28);
  mix((uint64_t)this,local_28);
  uVar1 = mix((uint64_t)this,local_28);
  return uVar1;
}

Assistant:

[[maybe_unused]] [[nodiscard]] static inline uint64_t hash(void const* key, size_t len) {
    static constexpr auto secret = std::array{UINT64_C(0xa0761d6478bd642f),
                                              UINT64_C(0xe7037ed1a0b428db),
                                              UINT64_C(0x8ebc6af09c88c6e3),
                                              UINT64_C(0x589965cc75374cc3)};

    auto const* p = static_cast<uint8_t const*>(key);
    uint64_t seed = secret[0];
    uint64_t a{};
    uint64_t b{};
    if (len <= 16) [[likely]] {
        if (len >= 4) [[likely]] {
            a = (r4(p) << 32U) | r4(p + ((len >> 3U) << 2U));
            b = (r4(p + len - 4) << 32U) | r4(p + len - 4 - ((len >> 3U) << 2U));
        }
        else if (len > 0) [[likely]] {
            a = r3(p, len);
            b = 0;
        }
        else {
            a = 0;
            b = 0;
        }
    }
    else {
        size_t i = len;
        if (i > 48) [[unlikely]] {
            uint64_t see1 = seed;
            uint64_t see2 = seed;
            do
                [[likely]] {
                    seed = mix(r8(p) ^ secret[1], r8(p + 8) ^ seed);
                    see1 = mix(r8(p + 16) ^ secret[2], r8(p + 24) ^ see1);
                    see2 = mix(r8(p + 32) ^ secret[3], r8(p + 40) ^ see2);
                    p += 48;
                    i -= 48;
                }
            while (i > 48);
            seed ^= see1 ^ see2;
        }
        while (i > 16) [[unlikely]] {
            seed = mix(r8(p) ^ secret[1], r8(p + 8) ^ seed);
            i -= 16;
            p += 16;
        }
        a = r8(p + i - 16);
        b = r8(p + i - 8);
    }

    return mix(secret[1] ^ len, mix(a ^ secret[1], b ^ seed));
}